

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dump.cpp
# Opt level: O3

void Utils::hexDump(FastString *out,uint8 *array,uint32 length,uint32 colSize,bool withAddress,
                   bool withCharVal)

{
  byte bVar1;
  uint32 k;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  String local_48;
  ulong local_38;
  
  if (length != 0) {
    uVar2 = -colSize;
    local_38 = (ulong)colSize;
    uVar3 = 0;
    do {
      uVar4 = (ulong)uVar2;
      if ((int)((uVar3 & 0xffffffff) % (ulong)colSize) == 0) {
        if ((uVar3 != 0 && withCharVal) && (Bstrlib::String::operator+=(out," "), local_38 <= uVar3)
           ) {
          do {
            bVar1 = array[uVar4];
            if ((char)bVar1 < ' ') {
              bVar1 = 0x2e;
            }
            Bstrlib::String::Print((char *)&local_48,"%c",(ulong)bVar1);
            Bstrlib::String::operator+=(out,&local_48);
            Bstrlib::String::~String(&local_48);
            uVar4 = uVar4 + 1;
          } while (uVar4 < uVar3);
        }
        Bstrlib::String::operator+=(out,"\n");
        if (withAddress) {
          Bstrlib::String::Print((char *)&local_48,"%08X ",uVar3 & 0xffffffff);
          Bstrlib::String::operator+=(out,&local_48);
          Bstrlib::String::~String(&local_48);
        }
      }
      Bstrlib::String::Print((char *)&local_48,"%02X ",(ulong)array[uVar3]);
      Bstrlib::String::operator+=(out,&local_48);
      Bstrlib::String::~String(&local_48);
      uVar3 = uVar3 + 1;
      uVar2 = uVar2 + 1;
    } while (uVar3 != length);
    if (withCharVal) {
      uVar2 = 0;
      do {
        Bstrlib::String::operator+=(out,"   ");
        uVar2 = uVar2 + 1;
      } while (uVar2 < colSize - length % colSize);
      Bstrlib::String::operator+=(out," ");
      if (length % colSize != 0) {
        uVar3 = (ulong)(length - length % colSize);
        do {
          bVar1 = array[uVar3];
          if ((char)array[uVar3] < ' ') {
            bVar1 = 0x2e;
          }
          Bstrlib::String::Print((char *)&local_48,"%c",(ulong)bVar1);
          Bstrlib::String::operator+=(out,&local_48);
          Bstrlib::String::~String(&local_48);
          uVar3 = uVar3 + 1;
        } while (uVar3 < length);
      }
    }
  }
  return;
}

Assistant:

void hexDump(Strings::FastString & out, const uint8 * const array, const uint32 length, const uint32 colSize, const bool withAddress, const bool withCharVal)
    {
        uint32 i = 0;
        for (; i < length; i++)
        {
            if ((i % colSize) == 0)
            {
                // Output the charVal if any present
                if (withCharVal && i)
                {
                    out += " ";
                    for (uint32 j = i - colSize; j < i; j++)
                    {
                        out += Strings::FastString::Print("%c", (array[j] < 32 || array[j] >= 0x80) ? '.' : array[j]);
                    }
                }

                out += "\n";
                if (withAddress)
                    out += Strings::FastString::Print("%08X ", i);

            }
            out += Strings::FastString::Print("%02X ", (unsigned int)array[i]);
        }
        // Output the charVal if any present
        if (withCharVal && i)
        {
            for (uint32 k = 0; k < colSize - (i % colSize); k++)
                out += "   ";

            out += " ";
            for (uint32 j = i - (i % colSize); j < i; j++)
            {
                out += Strings::FastString::Print("%c", (array[j] < 32 || array[j] >= 0x80) ? '.' : array[j]);
            }
        }
    }